

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Detail::anon_unknown_0::FileStream::FileStream(FileStream *this,StringRef filename)

{
  byte bVar1;
  char *pcVar2;
  ReusableStringStream *in_RDI;
  ReusableStringStream *in_stack_ffffffffffffff58;
  ReusableStringStream *in_stack_ffffffffffffff60;
  string *msg;
  StringRef *in_stack_ffffffffffffffb0;
  
  IStream::IStream((IStream *)in_RDI);
  (in_RDI->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__FileStream_0037cf40;
  std::ofstream::ofstream(&in_RDI->m_index);
  msg = (string *)&in_RDI->m_index;
  pcVar2 = StringRef::c_str(in_stack_ffffffffffffffb0);
  std::ofstream::open(msg,pcVar2,0x10);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    return;
  }
  ReusableStringStream::ReusableStringStream(in_RDI);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(char (*) [23])in_stack_ffffffffffffff58);
  ReusableStringStream::operator<<(in_stack_ffffffffffffff60,(StringRef *)in_stack_ffffffffffffff58)
  ;
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff60,(char (*) [2])in_stack_ffffffffffffff58);
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff58);
  throw_domain_error(msg);
}

Assistant:

FileStream( StringRef filename ) {
                m_ofs.open( filename.c_str() );
                CATCH_ENFORCE( !m_ofs.fail(), "Unable to open file: '" << filename << "'" );
            }